

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest_extra.cc
# Opt level: O2

EVP_MD * EVP_get_digestbynid(int nid)

{
  long lVar1;
  EVP_MD *pEVar2;
  long lVar3;
  
  if (nid != 0) {
    lVar1 = -0x18;
    while (lVar3 = lVar1, lVar3 + 0x20 != 0x248) {
      lVar1 = lVar3 + 0x20;
      if (*(int *)((long)&nid_to_digest_mapping[0].long_name + lVar3) == nid) {
        pEVar2 = (EVP_MD *)(**(code **)((long)&nid_to_digest_mapping[1].nid + lVar3))();
        return pEVar2;
      }
    }
  }
  return (EVP_MD *)0x0;
}

Assistant:

const EVP_MD *EVP_get_digestbynid(int nid) {
  if (nid == NID_undef) {
    // Skip the |NID_undef| entries in |nid_to_digest_mapping|.
    return NULL;
  }

  for (unsigned i = 0; i < OPENSSL_ARRAY_SIZE(nid_to_digest_mapping); i++) {
    if (nid_to_digest_mapping[i].nid == nid) {
      return nid_to_digest_mapping[i].md_func();
    }
  }

  return NULL;
}